

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readPDBrecs.c
# Opt level: O0

void parseSegID(char *line,char *id)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  int reclen;
  char *id_local;
  char *line_local;
  
  sVar3 = strlen(line);
  iVar2 = (int)sVar3;
  if (iVar2 < 0x49) {
    cVar1 = ' ';
  }
  else {
    cVar1 = line[0x48];
  }
  *id = cVar1;
  if (iVar2 < 0x4a) {
    cVar1 = ' ';
  }
  else {
    cVar1 = line[0x49];
  }
  id[1] = cVar1;
  if (iVar2 < 0x4b) {
    cVar1 = ' ';
  }
  else {
    cVar1 = line[0x4a];
  }
  id[2] = cVar1;
  if (iVar2 < 0x4c) {
    cVar1 = ' ';
  }
  else {
    cVar1 = line[0x4b];
  }
  id[3] = cVar1;
  id[4] = '\0';
  return;
}

Assistant:

void parseSegID(char *line, char id[]) {
   int reclen = strlen(line);
   id[0] = (reclen >= 73) ? line[72] : ' ';
   id[1] = (reclen >= 74) ? line[73] : ' ';
   id[2] = (reclen >= 75) ? line[74] : ' ';
   id[3] = (reclen >= 76) ? line[75] : ' ';
   id[4] = '\0';
}